

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

void __thiscall
SpeciesTracker::TerminateTranscription
          (SpeciesTracker *this,shared_ptr<PolymerWrapper> *wrapper,string *pol_name,
          string *gene_name)

{
  shared_ptr<Reaction> local_20;
  
  Increment(this,pol_name,1);
  local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((wrapper->super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Reaction;
  local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (wrapper->super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  Signal<std::shared_ptr<Reaction>_>::Emit(&this->propensity_signal_,&local_20);
  if (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void SpeciesTracker::TerminateTranscription(
    std::shared_ptr<PolymerWrapper> wrapper, const std::string &pol_name,
    const std::string &gene_name) {
  Increment(pol_name, 1);
  propensity_signal_.Emit(wrapper);
  // CountTermination("transcript");
}